

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse4_1.h
# Opt level: O0

__m128i highbd_comp_avg_sse4_1
                  (__m128i *data_ref_0,__m128i *res_unsigned,__m128i *wt0,__m128i *wt1,
                  int use_dist_wtd_avg)

{
  uint uVar1;
  __m128i alVar2;
  __m128i wt_res_1;
  __m128i wt_res;
  __m128i wt1_res;
  __m128i wt0_res;
  __m128i res;
  int use_dist_wtd_avg_local;
  __m128i *wt1_local;
  __m128i *wt0_local;
  __m128i *res_unsigned_local;
  __m128i *data_ref_0_local;
  
  if (use_dist_wtd_avg == 0) {
    uVar1 = 1;
  }
  else {
    pmulld((undefined1  [16])*data_ref_0,(undefined1  [16])*wt0);
    pmulld((undefined1  [16])*res_unsigned,(undefined1  [16])*wt1);
    uVar1 = 4;
  }
  alVar2[0] = (ulong)uVar1;
  alVar2[1] = (longlong)wt0;
  return alVar2;
}

Assistant:

static inline __m128i highbd_comp_avg_sse4_1(const __m128i *const data_ref_0,
                                             const __m128i *const res_unsigned,
                                             const __m128i *const wt0,
                                             const __m128i *const wt1,
                                             const int use_dist_wtd_avg) {
  __m128i res;
  if (use_dist_wtd_avg) {
    const __m128i wt0_res = _mm_mullo_epi32(*data_ref_0, *wt0);
    const __m128i wt1_res = _mm_mullo_epi32(*res_unsigned, *wt1);

    const __m128i wt_res = _mm_add_epi32(wt0_res, wt1_res);
    res = _mm_srai_epi32(wt_res, DIST_PRECISION_BITS);
  } else {
    const __m128i wt_res = _mm_add_epi32(*data_ref_0, *res_unsigned);
    res = _mm_srai_epi32(wt_res, 1);
  }
  return res;
}